

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O0

void mbedtls_ecp_fix_negative(mbedtls_mpi *N,char c,size_t bits)

{
  bool local_31;
  long local_30;
  mbedtls_mpi_uint msw;
  size_t i;
  size_t bits_local;
  char c_local;
  mbedtls_mpi *N_local;
  
  for (msw = 0; msw <= bits >> 6; msw = msw + 1) {
    N->p[msw] = -N->p[msw] - 1;
  }
  msw = 0;
  do {
    N->p[msw] = N->p[msw] + 1;
    local_31 = N->p[msw] == 0 && msw + 1 <= bits >> 6;
    msw = msw + 1;
  } while (local_31);
  N->s = -1;
  local_30 = (long)-(int)c;
  if (bits == 0xe0) {
    local_30 = local_30 << 0x20;
  }
  N->p[bits >> 6] = local_30 + N->p[bits >> 6];
  return;
}

Assistant:

static void mbedtls_ecp_fix_negative(mbedtls_mpi *N, signed char c, size_t bits)
{
    size_t i;

    /* Set N := 2^bits - 1 - N. We know that 0 <= N < 2^bits, so
     * set the absolute value to 0xfff...fff - N. There is no carry
     * since we're subtracting from all-bits-one.  */
    for (i = 0; i <= bits / 8 / sizeof(mbedtls_mpi_uint); i++) {
        N->p[i] = ~(mbedtls_mpi_uint) 0 - N->p[i];
    }
    /* Add 1, taking care of the carry. */
    i = 0;
    do {
        ++N->p[i];
    } while (N->p[i++] == 0 && i <= bits / 8 / sizeof(mbedtls_mpi_uint));
    /* Invert the sign.
     * Now N = N0 - 2^bits where N0 is the initial value of N. */
    N->s = -1;

    /* Add |c| * 2^bits to the absolute value. Since c and N are
     * negative, this adds c * 2^bits. */
    mbedtls_mpi_uint msw = (mbedtls_mpi_uint) -c;
#if defined(MBEDTLS_HAVE_INT64)
    if (bits == 224) {
        msw <<= 32;
    }
#endif
    N->p[bits / 8 / sizeof(mbedtls_mpi_uint)] += msw;
}